

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_string_vector.cc
# Opt level: O2

bool __thiscall s2coding::EncodedStringVector::Init(EncodedStringVector *this,Decoder *decoder)

{
  uint32 uVar1;
  bool bVar2;
  unsigned_long_long uVar3;
  size_t sVar4;
  
  bVar2 = EncodedUintVector<unsigned_long_long>::Init(&this->offsets_,decoder);
  if (bVar2) {
    this->data_ = (char *)decoder->buf_;
    uVar1 = (this->offsets_).size_;
    if (uVar1 == 0) {
      return true;
    }
    uVar3 = EncodedUintVector<unsigned_long_long>::operator[](&this->offsets_,uVar1 - 1);
    sVar4 = Decoder::avail(decoder);
    if (uVar3 <= sVar4) {
      decoder->buf_ = decoder->buf_ + uVar3;
      return true;
    }
  }
  return false;
}

Assistant:

bool EncodedStringVector::Init(Decoder* decoder) {
  if (!offsets_.Init(decoder)) return false;
  data_ = reinterpret_cast<const char*>(decoder->ptr());
  if (offsets_.size() > 0) {
    uint64 length = offsets_[offsets_.size() - 1];
    if (decoder->avail() < length) return false;
    decoder->skip(length);
  }
  return true;
}